

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigFanout.c
# Opt level: O3

void Aig_ManFanoutStart(Aig_Man_t *p)

{
  int iVar1;
  Aig_Obj_t *pFanout;
  int *__s;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  long lVar4;
  
  if (p->nObjs[4] != 0) {
    __assert_fail("Aig_ManBufNum(p) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigFanout.c"
                  ,0x3c,"void Aig_ManFanoutStart(Aig_Man_t *)");
  }
  if (p->pFanData == (int *)0x0) {
    pVVar3 = p->vObjs;
    iVar1 = pVVar3->nSize;
    iVar2 = 0x1000;
    if (0x7ff < iVar1) {
      iVar2 = iVar1 * 2;
    }
    p->nFansAlloc = iVar2;
    __s = (int *)malloc((long)(iVar2 * 5) << 2);
    p->pFanData = __s;
    memset(__s,0,(long)iVar2 * 0x14);
    if (0 < iVar1) {
      lVar4 = 0;
      do {
        pFanout = (Aig_Obj_t *)pVVar3->pArray[lVar4];
        if (pFanout != (Aig_Obj_t *)0x0) {
          if (pFanout->pFanin0 != (Aig_Obj_t *)0x0) {
            Aig_ObjAddFanout(p,(Aig_Obj_t *)((ulong)pFanout->pFanin0 & 0xfffffffffffffffe),pFanout);
          }
          if (pFanout->pFanin1 != (Aig_Obj_t *)0x0) {
            Aig_ObjAddFanout(p,(Aig_Obj_t *)((ulong)pFanout->pFanin1 & 0xfffffffffffffffe),pFanout);
          }
        }
        lVar4 = lVar4 + 1;
        pVVar3 = p->vObjs;
      } while (lVar4 < pVVar3->nSize);
    }
    return;
  }
  __assert_fail("p->pFanData == NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigFanout.c"
                ,0x3e,"void Aig_ManFanoutStart(Aig_Man_t *)");
}

Assistant:

void Aig_ManFanoutStart( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i;
    assert( Aig_ManBufNum(p) == 0 );
    // allocate fanout datastructure
    assert( p->pFanData == NULL );
    p->nFansAlloc = 2 * Aig_ManObjNumMax(p);
    if ( p->nFansAlloc < (1<<12) )
        p->nFansAlloc = (1<<12);
    p->pFanData = ABC_ALLOC( int, 5 * p->nFansAlloc );
    memset( p->pFanData, 0, sizeof(int) * 5 * p->nFansAlloc );
    // add fanouts for all objects
    Aig_ManForEachObj( p, pObj, i )
    {
        if ( Aig_ObjChild0(pObj) )
            Aig_ObjAddFanout( p, Aig_ObjFanin0(pObj), pObj );
        if ( Aig_ObjChild1(pObj) )
            Aig_ObjAddFanout( p, Aig_ObjFanin1(pObj), pObj );
    }
}